

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O3

char * xmlParserGetDirectory(char *filename)

{
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char dir [1024];
  char acStack_408 [1023];
  undefined1 local_9;
  
  if (filename == (char *)0x0) {
    return (char *)0x0;
  }
  pcVar4 = acStack_408;
  strncpy(acStack_408,filename,0x3ff);
  local_9 = 0;
  sVar1 = strlen(acStack_408);
  pcVar3 = acStack_408 + sVar1;
  if (0 < (long)sVar1) {
    do {
      if (*pcVar3 == '/') goto LAB_0015c6c1;
      pcVar3 = pcVar3 + -1;
    } while (acStack_408 < pcVar3);
  }
  if (*pcVar3 == '/') {
LAB_0015c6c1:
    pcVar2 = acStack_408 + 1;
    if (pcVar3 != acStack_408) {
      pcVar2 = pcVar3;
    }
    *pcVar2 = '\0';
  }
  else {
    pcVar4 = ".";
  }
  pcVar3 = (*xmlMemStrdup)(pcVar4);
  return pcVar3;
}

Assistant:

char *
xmlParserGetDirectory(const char *filename) {
    char *ret = NULL;
    char dir[1024];
    char *cur;

    if (filename == NULL) return(NULL);

#if defined(_WIN32)
#   define IS_XMLPGD_SEP(ch) ((ch=='/')||(ch=='\\'))
#else
#   define IS_XMLPGD_SEP(ch) (ch=='/')
#endif

    strncpy(dir, filename, 1023);
    dir[1023] = 0;
    cur = &dir[strlen(dir)];
    while (cur > dir) {
         if (IS_XMLPGD_SEP(*cur)) break;
	 cur --;
    }
    if (IS_XMLPGD_SEP(*cur)) {
        if (cur == dir) dir[1] = 0;
	else *cur = 0;
	ret = xmlMemStrdup(dir);
    } else {
        ret = xmlMemStrdup(".");
    }
    return(ret);
#undef IS_XMLPGD_SEP
}